

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::reserve
          (ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Member *pMVar3;
  undefined8 uVar4;
  Member *pMVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = this->numAllocated;
  if (uVar8 < minSize) {
    uVar6 = minSize + 0xf & 0xfffffffffffffff0;
    if (0x10 < uVar6) {
      pMVar5 = (Member *)operator_new__(uVar6 * 0x28);
      if (this->numActive != 0) {
        lVar7 = 0x20;
        uVar8 = 0;
        do {
          pMVar3 = this->items;
          puVar1 = (undefined8 *)((long)pMVar3 + lVar7 + -0x20);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pMVar5 + lVar7 + -0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)pMVar3 + lVar7 + -0x10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pMVar5 + lVar7 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          *(undefined8 *)((long)pMVar3 + lVar7 + -0x10) = 0;
          *(undefined8 *)((long)&(pMVar5->type).object + lVar7) =
               *(undefined8 *)((long)&(pMVar3->type).object + lVar7);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x28;
        } while (uVar8 < this->numActive);
        uVar8 = this->numAllocated;
      }
      if ((0x10 < uVar8) && (this->items != (Member *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = pMVar5;
    }
    this->numAllocated = uVar6;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }